

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Arena.cpp
# Opt level: O0

void amrex::Arena::Initialize(void)

{
  ArenaInfo info;
  int iVar1;
  CArena *pCVar2;
  long *plVar3;
  ArenaInfo *pAVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Arena *null_arena;
  void *p_2;
  void *p_1;
  void *p;
  ParmParse pp;
  bool *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  ParmParse *in_stack_fffffffffffffee0;
  PArena *in_stack_fffffffffffffee8;
  Arena *hunk_size;
  Arena *pAVar5;
  allocator *paVar6;
  Arena *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  ArenaInfo local_b8;
  Long local_a8;
  undefined8 uStack_a0;
  allocator local_81;
  string local_80 [120];
  Arena **local_8;
  
  if (((anonymous_namespace)::initialized & 1) == 0) {
    (anonymous_namespace)::initialized = 1;
    paVar6 = &local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"amrex",paVar6);
    ParmParse::ParmParse(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    ParmParse::queryAdd<long,_0>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (long *)in_stack_fffffffffffffed0);
    ParmParse::queryAdd<long,_0>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (long *)in_stack_fffffffffffffed0);
    ParmParse::queryAdd<long,_0>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (long *)in_stack_fffffffffffffed0);
    ParmParse::queryAdd<long,_0>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (long *)in_stack_fffffffffffffed0);
    ParmParse::queryAdd<long,_0>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (long *)in_stack_fffffffffffffed0);
    ParmParse::queryAdd<long,_0>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (long *)in_stack_fffffffffffffed0);
    ParmParse::queryAdd<long,_0>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (long *)in_stack_fffffffffffffed0);
    ParmParse::queryAdd<long,_0>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (long *)in_stack_fffffffffffffed0);
    ParmParse::queryAdd<long,_0>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (long *)in_stack_fffffffffffffed0);
    ParmParse::queryAdd<bool,_0>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
              );
    ParmParse::queryAdd<bool,_0>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
              );
    (anonymous_namespace)::the_arena = anon_unknown_4::The_BArena();
    pAVar5 = (anonymous_namespace)::the_arena;
    pCVar2 = (CArena *)operator_new(0x18);
    PArena::PArena(in_stack_fffffffffffffee8,(Long)in_stack_fffffffffffffee0);
    (anonymous_namespace)::the_async_arena = pCVar2;
    pCVar2 = (anonymous_namespace)::the_async_arena;
    (anonymous_namespace)::the_device_arena = anon_unknown_4::The_BArena();
    hunk_size = (anonymous_namespace)::the_device_arena;
    (anonymous_namespace)::the_managed_arena = anon_unknown_4::The_BArena();
    plVar3 = (long *)operator_new(0xd8);
    local_b8.release_threshold = std::numeric_limits<long>::max();
    local_b8.use_cpu_memory = false;
    local_b8.device_use_managed_memory = true;
    local_b8.device_set_readonly = false;
    local_b8.device_set_preferred = false;
    local_b8.device_use_hostalloc = false;
    pAVar4 = ArenaInfo::SetHostAlloc(&local_b8);
    pAVar4 = ArenaInfo::SetReleaseThreshold
                       (pAVar4,(anonymous_namespace)::the_pinned_arena_release_threshold);
    local_a8 = pAVar4->release_threshold;
    uStack_a0._0_1_ = pAVar4->use_cpu_memory;
    uStack_a0._1_1_ = pAVar4->device_use_managed_memory;
    uStack_a0._2_1_ = pAVar4->device_set_readonly;
    uStack_a0._3_1_ = pAVar4->device_set_preferred;
    uStack_a0._4_1_ = pAVar4->device_use_hostalloc;
    uStack_a0._5_3_ = *(undefined3 *)&pAVar4->field_0xd;
    info._8_8_ = paVar6;
    info.release_threshold = (Long)pAVar5;
    CArena::CArena(pCVar2,(size_t)hunk_size,info);
    (anonymous_namespace)::the_pinned_arena = plVar3;
    if ((0 < (anonymous_namespace)::the_device_arena_init_size) &&
       ((anonymous_namespace)::the_device_arena != (anonymous_namespace)::the_arena)) {
      iVar1 = (*(anonymous_namespace)::the_device_arena->_vptr_Arena[2])
                        ((anonymous_namespace)::the_device_arena,
                         (anonymous_namespace)::the_device_arena_init_size);
      local_c0 = CONCAT44(extraout_var,iVar1);
      (*(anonymous_namespace)::the_device_arena->_vptr_Arena[3])
                ((anonymous_namespace)::the_device_arena,local_c0);
    }
    if ((0 < (anonymous_namespace)::the_managed_arena_init_size) &&
       ((anonymous_namespace)::the_managed_arena != (anonymous_namespace)::the_arena)) {
      iVar1 = (*(anonymous_namespace)::the_managed_arena->_vptr_Arena[2])
                        ((anonymous_namespace)::the_managed_arena,
                         (anonymous_namespace)::the_managed_arena_init_size);
      local_c8 = CONCAT44(extraout_var_00,iVar1);
      (*(anonymous_namespace)::the_managed_arena->_vptr_Arena[3])
                ((anonymous_namespace)::the_managed_arena,local_c8);
    }
    if (0 < (anonymous_namespace)::the_pinned_arena_init_size) {
      local_d0 = (**(code **)(*(anonymous_namespace)::the_pinned_arena + 0x10))
                           ((anonymous_namespace)::the_pinned_arena,
                            (anonymous_namespace)::the_pinned_arena_init_size);
      (**(code **)(*(anonymous_namespace)::the_pinned_arena + 0x18))
                ((anonymous_namespace)::the_pinned_arena,local_d0);
    }
    (anonymous_namespace)::the_cpu_arena = anon_unknown_4::The_BArena();
    local_d8 = anon_unknown_4::The_Null_Arena();
    local_8 = &local_d8;
    ParmParse::~ParmParse((ParmParse *)0xf95490);
  }
  return;
}

Assistant:

void
Arena::Initialize ()
{
    if (initialized) return;
    initialized = true;

    BL_ASSERT(the_arena == nullptr);
    BL_ASSERT(the_async_arena == nullptr);
    BL_ASSERT(the_device_arena == nullptr);
    BL_ASSERT(the_managed_arena == nullptr);
    BL_ASSERT(the_pinned_arena == nullptr);
    BL_ASSERT(the_cpu_arena == nullptr);

#ifdef AMREX_USE_GPU
#ifdef AMREX_USE_DPCPP
    the_arena_init_size = 1024L*1024L*1024L; // xxxxx DPCPP: todo
#else
    the_arena_init_size = Gpu::Device::totalGlobalMem() / 4L * 3L;
#endif

    the_pinned_arena_release_threshold = Gpu::Device::totalGlobalMem();
#endif

    ParmParse pp("amrex");
    pp.queryAdd(        "the_arena_init_size",         the_arena_init_size);
    pp.queryAdd( "the_device_arena_init_size",  the_device_arena_init_size);
    pp.queryAdd("the_managed_arena_init_size", the_managed_arena_init_size);
    pp.queryAdd( "the_pinned_arena_init_size",  the_pinned_arena_init_size);
    pp.queryAdd(       "the_arena_release_threshold" ,         the_arena_release_threshold);
    pp.queryAdd( "the_device_arena_release_threshold",  the_device_arena_release_threshold);
    pp.queryAdd("the_managed_arena_release_threshold", the_managed_arena_release_threshold);
    pp.queryAdd( "the_pinned_arena_release_threshold",  the_pinned_arena_release_threshold);
    pp.queryAdd(  "the_async_arena_release_threshold",   the_async_arena_release_threshold);
    pp.queryAdd("the_arena_is_managed", the_arena_is_managed);
    pp.queryAdd("abort_on_out_of_gpu_memory", abort_on_out_of_gpu_memory);

    {
#if defined(BL_COALESCE_FABS) || defined(AMREX_USE_GPU)
        ArenaInfo ai{};
        ai.SetReleaseThreshold(the_arena_release_threshold);
        if (the_arena_is_managed) {
            the_arena = new CArena(0, ai.SetPreferred());
        } else {
            the_arena = new CArena(0, ai.SetDeviceMemory());
        }
#ifdef AMREX_USE_GPU
        void *p = the_arena->alloc(static_cast<std::size_t>(the_arena_init_size));
        the_arena->free(p);
#endif
#else
        the_arena = The_BArena();
#endif
    }

    the_async_arena = new PArena(the_async_arena_release_threshold);

#ifdef AMREX_USE_GPU
    if (the_arena->isDevice() || the_arena->isManaged()) {
        the_device_arena = the_arena;
    } else {
        the_device_arena = new CArena(0, ArenaInfo{}.SetDeviceMemory().SetReleaseThreshold
                                      (the_device_arena_release_threshold));
    }
#else
    the_device_arena = The_BArena();
#endif

#ifdef AMREX_USE_GPU
    if (the_arena->isManaged()) {
        the_managed_arena = the_arena;
    } else {
        the_managed_arena = new CArena(0, ArenaInfo{}.SetReleaseThreshold
                                       (the_managed_arena_release_threshold));
    }
#else
    the_managed_arena = The_BArena();
#endif

    // When USE_CUDA=FALSE, we call mlock to pin the cpu memory.
    // When USE_CUDA=TRUE, we call cudaHostAlloc to pin the host memory.
    the_pinned_arena = new CArena(0, ArenaInfo{}.SetHostAlloc().SetReleaseThreshold
                                  (the_pinned_arena_release_threshold));

    if (the_device_arena_init_size > 0 && the_device_arena != the_arena) {
        void *p = the_device_arena->alloc(the_device_arena_init_size);
        the_device_arena->free(p);
    }

    if (the_managed_arena_init_size > 0 && the_managed_arena != the_arena) {
        void *p = the_managed_arena->alloc(the_managed_arena_init_size);
        the_managed_arena->free(p);
    }

    if (the_pinned_arena_init_size > 0) {
        void *p = the_pinned_arena->alloc(the_pinned_arena_init_size);
        the_pinned_arena->free(p);
    }

    the_cpu_arena = The_BArena();

    // Initialize the null arena
    auto null_arena = The_Null_Arena();
    amrex::ignore_unused(null_arena);
}